

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O1

qsizetype findLocaleIndexById(QLocaleId localeId)

{
  bool bVar1;
  ulong uVar2;
  ushort uVar3;
  quint16 *pqVar4;
  
  uVar3 = localeId.language_id;
  if (uVar3 == 0 || locale_index[uVar3] != 0) {
    uVar2 = (ulong)locale_index[uVar3];
    pqVar4 = &locale_data[uVar2].m_script_id;
    while (((((uint6)localeId & 0xffff00000000) != 0 && (pqVar4[1] != localeId.territory_id)) ||
           ((localeId.script_id != 0 && (*pqVar4 != localeId.script_id))))) {
      uVar2 = uVar2 + 1;
      bVar1 = pqVar4[0x3d] != 0;
      if (uVar3 != 0) {
        bVar1 = pqVar4[0x3d] == uVar3;
      }
      pqVar4 = pqVar4 + 0x3e;
      if (!bVar1) {
        return -1;
      }
    }
  }
  else {
    uVar2 = 0;
  }
  return uVar2;
}

Assistant:

static qsizetype findLocaleIndexById(QLocaleId localeId) noexcept
{
    qsizetype idx = locale_index[localeId.language_id];
    // If there are no locales for specified language (so we we've got the
    // default language, which has no associated script or country), give up:
    if (localeId.language_id && idx == 0)
        return idx;

    Q_ASSERT(localeId.acceptLanguage(locale_data[idx].m_language_id));

    do {
        if (localeId.acceptScriptTerritory(locale_data[idx].id()))
            return idx;
        ++idx;
    } while (localeId.acceptLanguage(locale_data[idx].m_language_id));

    return -1;
}